

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O1

int fp_test(char *infits,char *outfits,char *outfits2)

{
  fitsfile *pfVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  fitsfile *pfVar6;
  fitsfile *unaff_RBP;
  undefined8 uVar7;
  long *plVar8;
  undefined8 *puVar9;
  long *plVar10;
  double *pdVar11;
  int iVar12;
  byte bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  int iStack0000000000000008;
  float fStack000000000000000c;
  int iStack0000000000000010;
  int iStack0000000000000014;
  uint uStack0000000000000018;
  float fStack000000000000001c;
  float fStack0000000000000020;
  int iStack0000000000000024;
  int iStack0000000000000028;
  float fStack000000000000002c;
  float in_stack_00000030;
  undefined8 in_stack_00000080;
  int in_stack_00000088;
  char in_stack_0000049c;
  fitsfile *outfptr;
  int naxis;
  fitsfile *inputfptr;
  int bitpix;
  int stat;
  int hdunum;
  int tstatus;
  int hdutype;
  fitsfile *tempfile;
  char dtype [8];
  fitsfile *outfptr2;
  float row_cpu;
  float row_elapse;
  double bscale;
  float whole_elapse;
  float whole_cpu;
  int ncols;
  imgstats imagestats;
  LONGLONG nrows;
  long dataend;
  long datastart;
  long naxes [9];
  long headstart;
  char dimen [100];
  double local_8f8;
  uint local_8f0;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  fitsfile *local_250;
  int local_244;
  fitsfile *local_240;
  uint local_234;
  int local_230;
  int local_22c;
  uint local_228;
  uint local_224;
  int local_220;
  int local_21c;
  fitsfile *local_218;
  undefined4 local_210 [2];
  fitsfile *local_208;
  undefined8 uStack_200;
  double local_1f0;
  fitsfile *local_1e8;
  float local_1e0;
  float local_1dc;
  double local_1d8;
  char *local_1d0;
  float local_1c4;
  float local_1c0;
  uint local_1bc;
  imgstats local_1b8;
  long *local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  undefined8 local_128;
  LONGLONG local_120;
  long local_118;
  long local_110;
  long local_108;
  double local_100 [9];
  double local_b8;
  undefined8 uStack_b0;
  long local_a0;
  char local_98 [104];
  
  bVar13 = 0;
  plVar8 = &DAT_001c9ce0;
  plVar10 = &local_108;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *plVar10 = *plVar8;
    plVar8 = plVar8 + 1;
    plVar10 = plVar10 + 1;
  }
  local_22c = 0;
  local_244 = 0;
  local_234 = 0;
  local_220 = 0;
  local_1d0 = infits;
  ffopentest(10,&local_240,infits,0,&local_22c);
  ffinit(&local_250,outfits,&local_22c);
  ffinit(&local_1e8,outfits2,&local_22c);
  if (local_22c != 0) {
    ffrprt(_stderr,local_22c);
    exit(local_22c);
  }
  local_170 = (long *)&stack0x00000038;
  local_228 = 0;
  iVar12 = 0;
  do {
    if (local_22c != 0) {
      if (local_22c == 0x6b) {
        local_22c = 0;
      }
      ffclos(local_1e8,&local_22c);
      ffclos(local_250,&local_22c);
      ffclos(local_240,&local_22c);
      if (local_22c != 0) {
        ffrprt(_stderr,local_22c);
      }
      return 0;
    }
    ffghdt(local_240,&local_21c,&local_22c);
    if (local_21c == 0) {
      ffgipr(local_240,9,(int *)&local_234,&local_244,&local_108,&local_22c);
      iVar12 = 1;
      lVar5 = 0;
      do {
        iVar12 = iVar12 * (int)(&local_108)[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 9);
    }
    iVar3 = fits_is_compressed_image(local_240,&local_22c);
    pfVar6 = local_208;
    if ((((iVar3 == 0) && (local_21c == 0)) && (local_244 != 0)) &&
       ((iVar12 != 0 && (in_stack_00000080._4_4_ != 0)))) {
      uVar7 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      if (((fStack0000000000000020 != 0.0) || (NAN(fStack0000000000000020))) &&
         (local_234 - 1 < 0x3f)) {
        local_220 = 0;
        ffgky(local_240,0x52,"BSCALE",&local_1d8,(char *)0x0,&local_220);
        if ((local_220 == 0) && ((local_1d8 != 1.0 || (NAN(local_1d8))))) {
          if (local_234 == 0x20) {
            fp_i4stat(local_240,local_244,&local_108,&local_1b8,&local_22c);
          }
          else {
            fp_i2stat(local_240,local_244,&local_108,&local_1b8,&local_22c);
          }
          uVar14 = SUB84(local_1b8.noise2,0);
          uVar15 = (undefined4)((ulong)local_1b8.noise2 >> 0x20);
          if (local_1b8.noise3 <= local_1b8.noise2 || local_1b8.noise2 == 0.0) {
            uVar14 = SUB84(local_1b8.noise3,0);
            uVar15 = (undefined4)((ulong)local_1b8.noise3 >> 0x20);
          }
          dVar16 = local_1b8.noise5;
          if (local_1b8.noise5 == 0.0 || (double)CONCAT44(uVar15,uVar14) <= local_1b8.noise5) {
            dVar16 = (double)CONCAT44(uVar15,uVar14);
          }
          if (1.0 < dVar16 / (double)fStack0000000000000020) {
            uStack_200 = 0;
            local_208 = (fitsfile *)(dVar16 / (double)fStack0000000000000020);
            fp_tmpnam("Tmpfile3","",tempfilename3);
            ffinit(&local_218,tempfilename3,&local_22c);
            ffghdn(local_240,(int *)&local_224);
            if (local_224 != 1) {
              ffcrim(local_218,8,0,&local_108,&local_22c);
            }
            ffcphd(local_240,local_218,&local_22c);
            if (local_234 == 0x20) {
              fp_i4rescale(local_240,local_244,&local_108,(double)local_208,local_218,&local_22c);
            }
            else {
              fp_i2rescale(local_240,local_244,&local_108,(double)local_208,local_218,&local_22c);
            }
            local_1d8 = (double)local_208 * local_1d8;
            uVar7 = 0;
            ffuky(local_218,0x52,"BSCALE",&local_1d8,(char *)0x0,&local_22c);
            ffrdef(local_218,&local_22c);
            pfVar6 = local_218;
          }
        }
      }
      if ((char)uVar7 != '\0') {
        pfVar6 = local_240;
      }
      if ((int)local_234 < 0x10) {
        if (local_234 == 0xffffffc0) {
          local_210[0] = 0x34362d;
          fp_r4stat(pfVar6,local_244,&local_108,&local_1b8,&local_22c);
LAB_00108b22:
          local_230 = 0x40;
        }
        else if (local_234 == 0xffffffe0) {
          local_210[0] = 0x32332d;
          fp_r4stat(pfVar6,local_244,&local_108,&local_1b8,&local_22c);
LAB_00108bc8:
          local_230 = 0x20;
        }
        else if (local_234 == 8) {
          local_210[0] = 0x202038;
          fp_i2stat(pfVar6,local_244,&local_108,&local_1b8,&local_22c);
          local_230 = 8;
        }
      }
      else if (local_234 == 0x10) {
        local_210[0] = 0x203631;
        fp_i2stat(pfVar6,local_244,&local_108,&local_1b8,&local_22c);
        local_230 = 0x10;
      }
      else {
        if (local_234 == 0x20) {
          local_210[0] = 0x203233;
          fp_i4stat(pfVar6,local_244,&local_108,&local_1b8,&local_22c);
          goto LAB_00108bc8;
        }
        if (local_234 == 0x40) {
          local_210[0] = 0x203436;
          goto LAB_00108b22;
        }
      }
      dVar16 = local_1b8.noise2;
      if (local_1b8.noise3 <= local_1b8.noise2 || local_1b8.noise2 == 0.0) {
        dVar16 = local_1b8.noise3;
      }
      uVar14 = SUB84(local_1b8.noise5,0);
      uVar15 = (undefined4)((ulong)local_1b8.noise5 >> 0x20);
      if (local_1b8.noise5 == 0.0 || dVar16 <= local_1b8.noise5) {
        uVar14 = SUB84(dVar16,0);
        uVar15 = (undefined4)((ulong)dVar16 >> 0x20);
      }
      local_b8 = (double)CONCAT44(uVar15,uVar14);
      uStack_b0 = 0;
      local_208 = pfVar6;
      local_128 = uVar7;
      dVar16 = log10((double)CONCAT44(uVar15,uVar14));
      local_1f0 = dVar16 / 0.301 + 1.792;
      printf("\n File: %s\n",local_1d0);
      puts(
          "  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR"
          );
      printf("  %3d  %s",(ulong)local_228,local_210);
      snprintf(local_98,100," (%ld",local_108);
      if (1 < local_244) {
        sVar4 = strlen(local_98);
        lVar5 = 1;
        do {
          iVar3 = (int)sVar4;
          if (iVar3 < 99) {
            snprintf(local_98 + iVar3,(ulong)(100 - iVar3),",%ld",(&local_108)[lVar5]);
          }
          sVar4 = strlen(local_98);
          lVar5 = lVar5 + 1;
        } while (lVar5 < local_244);
      }
      sVar4 = strlen(local_98);
      if (sVar4 < 99) {
        sVar4 = strlen(local_98);
        (local_98 + sVar4)[0] = ')';
        (local_98 + sVar4)[1] = '\0';
      }
      local_1f0 = (double)CONCAT44(local_1f0._4_4_,(float)local_1f0);
      printf("%-12s",local_98);
      ffghad(local_240,&local_a0,&local_110,&local_118,&local_22c);
      lVar2 = local_110;
      lVar5 = local_118;
      fits_read_image_speed(local_208,&local_1c4,&local_1c0,&local_1dc,&local_1e0,&local_22c);
      iVar3 = local_1b8.n_nulls;
      local_8f8 = (double)((float)local_230 / local_1f0._0_4_);
      local_138 = local_1b8.minval;
      local_140 = local_1b8.maxval;
      local_148 = local_1b8.mean;
      local_150 = local_1b8.sigma;
      local_1f0 = local_1b8.noise2;
      local_130 = local_1b8.noise3;
      local_158 = local_1b8.noise5;
      printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
             (ulong)(uint)local_1b8.n_nulls);
      puts("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1");
      local_160 = (double)local_1c4;
      local_168 = (double)local_1c0;
      printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n",
             SUB84(local_160,0),local_168,SUB84((double)local_1dc,0),SUB84((double)local_1e0,0));
      if (in_stack_0000049c != '\0') {
        local_8d0 = (double)local_1dc;
        local_8c8 = (double)local_1e0;
        local_8d8 = local_168;
        local_8e0 = local_160;
        local_8e8 = local_158;
        local_8f0 = iVar3;
        local_8f8 = local_100[0];
        fprintf((FILE *)outreport,
                " %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g"
                ,SUB84((double)(float)((double)(lVar5 - lVar2) / 1000000.0),0),local_138,
                SUB84(local_140,0),SUB84(local_148,0),local_150,local_1b8.noise1,local_1f0,local_130
                ,local_1d0,(ulong)local_228,(ulong)local_234,local_108);
      }
      fits_set_lossy_int(local_250,iStack0000000000000028,&local_22c);
      if (((0 < (int)local_234) && (iStack0000000000000028 != 0)) &&
         ((local_b8 < (double)(fStack000000000000002c * fStack000000000000000c) ||
          (local_b8 < (double)in_stack_00000030)))) {
        fits_set_lossy_int(local_250,0,&local_22c);
        ffghdn(local_208,(int *)&local_224);
        printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n"
               ,(ulong)local_224);
      }
      plVar8 = local_170;
      if ((fStack000000000000000c != 0.0) || (NAN(fStack000000000000000c))) {
        fits_set_compression_type(local_250,0xb,&local_22c);
        fits_set_tile_dim(local_250,6,plVar8,&local_22c);
        fits_set_quantize_method
                  (local_250,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,
                   &local_22c);
        fits_set_quantize_level(local_250,fStack000000000000000c,&local_22c);
        fits_set_dither_offset(local_250,iStack0000000000000014,&local_22c);
        fits_set_hcomp_scale(local_250,fStack000000000000001c,&local_22c);
        fits_set_hcomp_smooth(local_250,iStack0000000000000024,&local_22c);
        pfVar1 = local_1e8;
        pfVar6 = local_250;
        puVar9 = (undefined8 *)&stack0x00000008;
        pdVar11 = &local_8f8;
        for (lVar5 = 0xd5; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pdVar11 = (double)*puVar9;
          puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
          pdVar11 = pdVar11 + (ulong)bVar13 * -2 + 1;
        }
        fp_test_hdu(local_208,pfVar6,pfVar1,&local_22c);
      }
      unaff_RBP = local_208;
      if ((fStack000000000000000c != 0.0) || (NAN(fStack000000000000000c))) {
        fits_set_compression_type(local_250,0x29,&local_22c);
        fits_set_tile_dim(local_250,6,plVar8,&local_22c);
        fits_set_quantize_method
                  (local_250,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,
                   &local_22c);
        fits_set_quantize_level(local_250,fStack000000000000000c,&local_22c);
        fits_set_dither_offset(local_250,iStack0000000000000014,&local_22c);
        fits_set_hcomp_scale(local_250,fStack000000000000001c,&local_22c);
        fits_set_hcomp_smooth(local_250,iStack0000000000000024,&local_22c);
        pfVar1 = local_1e8;
        pfVar6 = local_250;
        puVar9 = (undefined8 *)&stack0x00000008;
        pdVar11 = &local_8f8;
        for (lVar5 = 0xd5; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pdVar11 = (double)*puVar9;
          puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
          pdVar11 = pdVar11 + (ulong)bVar13 * -2 + 1;
        }
        fp_test_hdu(unaff_RBP,pfVar6,pfVar1,&local_22c);
      }
      fits_set_compression_type(local_250,(iStack0000000000000008 == 0x16) + 0x15,&local_22c);
      fits_set_tile_dim(local_250,6,plVar8,&local_22c);
      fits_set_quantize_method
                (local_250,-(uint)(iStack0000000000000010 != 0) | uStack0000000000000018,&local_22c)
      ;
      fits_set_quantize_level(local_250,fStack000000000000000c,&local_22c);
      fits_set_dither_offset(local_250,iStack0000000000000014,&local_22c);
      fits_set_hcomp_scale(local_250,fStack000000000000001c,&local_22c);
      fits_set_hcomp_smooth(local_250,iStack0000000000000024,&local_22c);
      pfVar1 = local_1e8;
      pfVar6 = local_250;
      puVar9 = (undefined8 *)&stack0x00000008;
      pdVar11 = &local_8f8;
      for (lVar5 = 0xd5; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar11 = (double)*puVar9;
        puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
        pdVar11 = pdVar11 + (ulong)bVar13 * -2 + 1;
      }
      fp_test_hdu(unaff_RBP,pfVar6,pfVar1,&local_22c);
      if (in_stack_0000049c != '\0') {
        fputc(10,(FILE *)outreport);
      }
      if ((char)local_128 == '\0') {
        ffdelt(local_208,&local_22c);
        tempfilename3[0] = '\0';
      }
    }
    else if ((local_21c == 2) && (in_stack_00000088 != 0)) {
      ffgnrwll(local_240,&local_120,&local_22c);
      ffgncl(local_240,(int *)&local_1bc,&local_22c);
      printf("\n File: %s, HDU %d,  %d cols X %lld rows\n",local_1d0,(ulong)local_228,
             (ulong)local_1bc);
      pfVar1 = local_240;
      pfVar6 = local_250;
      puVar9 = (undefined8 *)&stack0x00000008;
      pdVar11 = &local_8f8;
      for (lVar5 = 0xd5; lVar5 != 0; lVar5 = lVar5 + -1) {
        *pdVar11 = (double)*puVar9;
        puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
        pdVar11 = pdVar11 + (ulong)bVar13 * -2 + 1;
      }
      fp_test_table(pfVar1,pfVar6,pfVar6,&local_22c);
    }
    else {
      ffcopy(local_240,local_250,0,&local_22c);
      ffcopy(local_240,local_1e8,0,&local_22c);
    }
    ffmrhd(local_240,1,(int *)0x0,&local_22c);
    local_228 = local_228 + 1;
  } while( true );
}

Assistant:

int fp_test (char *infits, char *outfits, char *outfits2, fpstate fpvar)
{
	fitsfile *inputfptr, *infptr, *outfptr, *outfptr2, *tempfile;

	long	naxes[9] = {1, 1, 1, 1, 1, 1, 1, 1, 1};
	int	stat=0, totpix=0, naxis=0, ii, hdutype, bitpix = 0, extnum = 0, len;
	int     tstatus = 0, hdunum, rescale_flag, bpix, ncols;
	char	dtype[8], dimen[100];
	double  bscale, rescale, noisemin;
	long headstart, datastart, dataend;
	float origdata = 0., whole_cpu, whole_elapse, row_elapse, row_cpu, xbits;

	LONGLONG nrows;
	/* structure to hold image statistics (defined in fpack.h) */
	imgstats imagestats;

	fits_open_file (&inputfptr, infits, READONLY, &stat);
	fits_create_file (&outfptr, outfits, &stat);
	fits_create_file (&outfptr2, outfits2, &stat);

	if (stat) { fits_report_error (stderr, stat); exit (stat); }

	while (! stat) {
	    
	    /*  LOOP OVER EACH HDU */
	    rescale_flag = 0;
	    fits_get_hdu_type (inputfptr, &hdutype, &stat);

	    if (hdutype == IMAGE_HDU) {
	        fits_get_img_param (inputfptr, 9, &bitpix, &naxis, naxes, &stat);
	        for (totpix=1, ii=0; ii < 9; ii++) totpix *= naxes[ii];
	    }

	    if (!fits_is_compressed_image (inputfptr,  &stat) && hdutype == IMAGE_HDU &&
		naxis != 0 && totpix != 0 && fpvar.do_images) {

		/* rescale a scaled integer image to reduce noise? */
		if (fpvar.rescale_noise != 0. && bitpix > 0 && bitpix < LONGLONG_IMG) {

		   tstatus = 0;
		   fits_read_key(inputfptr, TDOUBLE, "BSCALE", &bscale, 0, &tstatus);

		   if (tstatus == 0 && bscale != 1.0) {  /* image must be scaled */

			if (bitpix == LONG_IMG)
			  fp_i4stat(inputfptr, naxis, naxes, &imagestats, &stat);
			else
			  fp_i2stat(inputfptr, naxis, naxes, &imagestats, &stat);

			/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
			noisemin = imagestats.noise3;
			if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
			if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

			rescale = noisemin / fpvar.rescale_noise;
			if (rescale > 1.0) {
			  
			  /* all the criteria are met, so create a temporary file that */
			  /* contains a rescaled version of the image, in CWD */
			  
                	  /* create temporary file name */
			  fp_tmpnam("Tmpfile3", "", tempfilename3);

			  fits_create_file(&tempfile, tempfilename3, &stat);

			  fits_get_hdu_num(inputfptr, &hdunum);
			  if (hdunum != 1) {

			     /* the input hdu is an image extension, so create dummy primary */
			     fits_create_img(tempfile, 8, 0, naxes, &stat);
			  }

			  fits_copy_header(inputfptr, tempfile, &stat); /* copy the header */
			  
			  /* rescale the data, so that it will compress more efficiently */
			  if (bitpix == LONG_IMG)
			    fp_i4rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);
			  else
			    fp_i2rescale(inputfptr, naxis, naxes, rescale, tempfile, &stat);

			  /* scale the BSCALE keyword by the inverse factor */

			  bscale = bscale * rescale;  
			  fits_update_key(tempfile, TDOUBLE, "BSCALE", &bscale, 0, &stat);

			  /* rescan the header, to reset the actual scaling parameters */
			  fits_set_hdustruc(tempfile, &stat);

			  infptr = tempfile;
			  rescale_flag = 1;
			}
		   }
		 }

		if (!rescale_flag)   /* just compress the input file, without rescaling */
		   infptr = inputfptr;

		/* compute basic statistics about the input image */
                if (bitpix == BYTE_IMG) {
		   bpix = 8;
		   strcpy(dtype, "8  ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == SHORT_IMG) {
		   bpix = 16;
		   strcpy(dtype, "16 ");
		   fp_i2stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONG_IMG) {
		   bpix = 32;
		   strcpy(dtype, "32 ");
		   fp_i4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == LONGLONG_IMG) {
		   bpix = 64;
		   strcpy(dtype, "64 ");
		} else if (bitpix == FLOAT_IMG)   {
		   bpix = 32;
		   strcpy(dtype, "-32");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		} else if (bitpix == DOUBLE_IMG)  {
		   bpix = 64;
		   strcpy(dtype, "-64");
		   fp_r4stat(infptr, naxis, naxes, &imagestats, &stat);
		}

		/* use the minimum of the MAD 2nd, 3rd, and 5th order noise estimates */
		noisemin = imagestats.noise3;
		if (imagestats.noise2 != 0. && imagestats.noise2 < noisemin) noisemin = imagestats.noise2;
		if (imagestats.noise5 != 0. && imagestats.noise5 < noisemin) noisemin = imagestats.noise5;

                xbits = (float) (log10(noisemin)/.301 + 1.792);

		printf("\n File: %s\n", infits);
		printf("  Ext BITPIX Dimens.   Nulls    Min    Max     Mean    Sigma  Noise2  Noise3  Noise5  Nbits   MaxR\n");

		printf("  %3d  %s", extnum, dtype);
		snprintf(dimen,100," (%ld", naxes[0]);
		len =strlen(dimen);
		for (ii = 1; ii < naxis; ii++) {
                    if (len < 99)
		       snprintf(dimen+len,100-len,",%ld", naxes[ii]);
		    len =strlen(dimen);
		}
                if (strlen(dimen)<99)
		   strcat(dimen, ")");
		printf("%-12s",dimen);

		fits_get_hduaddr(inputfptr, &headstart, &datastart, &dataend, &stat);
		origdata = (float) ((dataend - datastart)/1000000.);

		/* get elapsed and cpu times need to read the uncompressed image */
		fits_read_image_speed (infptr, &whole_elapse, &whole_cpu,
		               &row_elapse, &row_cpu, &stat);

		printf(" %5d %6.0f %6.0f %8.1f %#8.2g %#7.3g %#7.3g %#7.3g %#5.1f %#6.2f\n",
		        imagestats.n_nulls, imagestats.minval, imagestats.maxval, 
		      imagestats.mean, imagestats.sigma, 
		      imagestats.noise2, imagestats.noise3, imagestats.noise5, xbits, bpix/xbits);

		printf("\n       Type   Ratio       Size (MB)     Pk (Sec) UnPk Exact ElpN CPUN  Elp1  CPU1\n");

		printf("       Native                                             %5.3f %5.3f %5.3f %5.3f\n",
		        whole_elapse, whole_cpu, row_elapse, row_cpu);

		if (fpvar.outfile[0]) {
		    fprintf(outreport,
	" %s  %d %d %ld %ld %#10.4g %d %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g %#10.4g",
		      infits, extnum, bitpix, naxes[0], naxes[1], origdata, imagestats.n_nulls, imagestats.minval, 
		      imagestats.maxval, imagestats.mean, imagestats.sigma, 
		      imagestats.noise1, imagestats.noise2, imagestats.noise3, imagestats.noise5, whole_elapse, whole_cpu, row_elapse, row_cpu);
		}

		fits_set_lossy_int (outfptr, fpvar.int_to_float, &stat);
		if ( (bitpix > 0) && (fpvar.int_to_float != 0) ) {

			if ( (noisemin < (fpvar.n3ratio * fpvar.quantize_level) ) ||
			    (noisemin < fpvar.n3min)) {
			
			    /* image contains too little noise to quantize effectively */
			    fits_set_lossy_int (outfptr, 0, &stat);
			    fits_get_hdu_num(infptr, &hdunum);

printf("    HDU %d does not meet noise criteria to be quantized, so losslessly compressed.\n", hdunum);
			} 
		}

		/* test compression ratio and speed for each algorithm */

		if (fpvar.quantize_level != 0) {

		  fits_set_compression_type (outfptr, RICE_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.quantize_level != 0) {
\
  		  fits_set_compression_type (outfptr, HCOMPRESS_1, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		  if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		  else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		  fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		  fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		  fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		  fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
		}

		if (fpvar.comptype == GZIP_2) {
		    fits_set_compression_type (outfptr, GZIP_2, &stat);
		} else {
		    fits_set_compression_type (outfptr, GZIP_1, &stat);
		}

		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);

		if (fpvar.no_dither)
	    	    fits_set_quantize_method(outfptr, -1, &stat);
		else
	    	    fits_set_quantize_method(outfptr, fpvar.dither_method, &stat);

		fits_set_quantize_level (outfptr, fpvar.quantize_level, &stat);
		fits_set_dither_offset(outfptr, fpvar.dither_offset, &stat);
		fits_set_hcomp_scale (outfptr, fpvar.scale, &stat);
		fits_set_hcomp_smooth (outfptr, fpvar.smooth, &stat);

		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);

/*
		fits_set_compression_type (outfptr, BZIP2_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
		fits_set_compression_type (outfptr, PLIO_1, &stat);
		fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);
*/
/*
                if (bitpix == SHORT_IMG || bitpix == LONG_IMG) {
		  fits_set_compression_type (outfptr, NOCOMPRESS, &stat);
		  fits_set_tile_dim (outfptr, 6, fpvar.ntile, &stat);
		  fp_test_hdu(infptr, outfptr, outfptr2, fpvar, &stat);	  
		}
*/
		if (fpvar.outfile[0])
		    fprintf(outreport,"\n");

		/* delete the temporary file */
		if (rescale_flag)  { 
		    fits_delete_file (infptr, &stat);
		    tempfilename3[0] = '\0';   /* clear the temp filename */ 
                }
	    } else if ( (hdutype == BINARY_TBL) && fpvar.do_tables) {

    		fits_get_num_rowsll(inputfptr, &nrows, &stat);
    		fits_get_num_cols(inputfptr, &ncols, &stat);
#if defined(_MSC_VER)
                /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
 		printf("\n File: %s, HDU %d,  %d cols X %I64d rows\n", infits, extnum, ncols, nrows);
#elif (USE_LL_SUFFIX == 1)
 		printf("\n File: %s, HDU %d,  %d cols X %lld rows\n", infits, extnum, ncols, nrows);
#else
 		printf("\n File: %s, HDU %d,  %d cols X %ld rows\n", infits, extnum, ncols, nrows);
#endif
		fp_test_table(inputfptr, outfptr, outfptr2, fpvar, &stat);	  

	    } else {
		fits_copy_hdu (inputfptr, outfptr, 0, &stat);
		fits_copy_hdu (inputfptr, outfptr2, 0, &stat);
	    }

	    fits_movrel_hdu (inputfptr, 1, NULL, &stat);
            extnum++;
	}


	if (stat == END_OF_FILE) stat = 0;

	fits_close_file (outfptr2, &stat);
	fits_close_file (outfptr, &stat);
	fits_close_file (inputfptr, &stat);

	if (stat) {
	  fits_report_error (stderr, stat);
	}
	return(0);
}